

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CfgFileParser::doParse(CfgFileParser *this)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  long lVar4;
  Option *pOVar5;
  undefined8 uVar6;
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *pIVar7;
  long in_RDI;
  size_type pos;
  string line;
  SharedOptPtr opt;
  FindType ft;
  bool inSection;
  string sectionValue;
  string sectionName;
  int lineNr;
  undefined4 in_stack_fffffffffffffdf8;
  FindType in_stack_fffffffffffffdfc;
  Option *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  CfgFileParser *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  string *seperator;
  undefined7 in_stack_fffffffffffffe30;
  byte in_stack_fffffffffffffe37;
  CfgFileParser *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 local_171 [40];
  undefined1 local_149 [40];
  undefined1 local_121 [40];
  byte local_f9;
  long local_f0;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [48];
  string local_80 [32];
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> local_60;
  undefined4 local_58;
  byte local_51;
  string local_50 [32];
  string local_30 [36];
  int local_c;
  
  local_c = 0;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  local_51 = 0;
  local_58 = 3;
  detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::IntrusiveSharedPtr
            (&local_60,(Option *)0x0);
  std::__cxx11::string::string(local_80);
  while( true ) {
    while( true ) {
      while( true ) {
        piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (*(istream **)(in_RDI + 0x10),local_80);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
        if (!bVar1) {
          std::__cxx11::string::~string(local_80);
          if ((local_51 & 1) != 0) {
            std::__cxx11::string::c_str();
            OptionParser::getOption
                      ((OptionParser *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                       in_stack_fffffffffffffdfc);
            pIVar7 = detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator=
                               ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                                in_stack_fffffffffffffe00,
                                (IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                                CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
            in_stack_fffffffffffffe00 =
                 detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::get(pIVar7);
            detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
                      ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                       in_stack_fffffffffffffe00);
            if (in_stack_fffffffffffffe00 != (Option *)0x0) {
              OptionParser::addOptionValue
                        ((OptionParser *)in_stack_fffffffffffffe00,
                         (SharedOptPtr *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         (string *)0x25b996);
            }
          }
          detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
                    ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                     in_stack_fffffffffffffe00);
          std::__cxx11::string::~string(local_50);
          std::__cxx11::string::~string(local_30);
          return;
        }
        local_c = local_c + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b0," \t",&local_b1);
        trimLeft(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 (string *)in_stack_fffffffffffffe00);
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d8," \t",&local_d9);
        trimRight(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                  (string *)in_stack_fffffffffffffe00);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) == 0) &&
           (lVar4 = std::__cxx11::string::find((char *)local_80,0x27f498), lVar4 != 0)) break;
        if ((local_51 & 1) != 0) {
          std::__cxx11::string::c_str();
          OptionParser::getOption
                    ((OptionParser *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                     in_stack_fffffffffffffdfc);
          pIVar7 = detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator=
                             ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                              in_stack_fffffffffffffe00,
                              (IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                              CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          pOVar5 = detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::get(pIVar7);
          detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
                    ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                     in_stack_fffffffffffffe00);
          if (pOVar5 != (Option *)0x0) {
            OptionParser::addOptionValue
                      ((OptionParser *)in_stack_fffffffffffffe00,
                       (SharedOptPtr *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                       ,(string *)0x25b423);
          }
          local_51 = 0;
        }
      }
      local_f0 = std::__cxx11::string::find((char *)local_80,0x28011b);
      if (local_f0 == -1) break;
      local_f9 = 0;
      in_stack_fffffffffffffe37 = false;
      if ((local_51 & 1) != 0) {
        std::__cxx11::string::c_str();
        OptionParser::getOption
                  ((OptionParser *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdfc);
        local_f9 = 1;
        in_stack_fffffffffffffe38 =
             (CfgFileParser *)
             detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator=
                       ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                        in_stack_fffffffffffffe00,
                        (IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        pOVar5 = detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::get
                           ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                            in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe37 = pOVar5 != (Option *)0x0;
      }
      in_stack_fffffffffffffe47 = in_stack_fffffffffffffe37;
      if ((local_f9 & 1) != 0) {
        detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
                  ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)in_stack_fffffffffffffe00
                  );
      }
      if ((in_stack_fffffffffffffe37 & 1) != 0) {
        OptionParser::addOptionValue
                  ((OptionParser *)in_stack_fffffffffffffe00,
                   (SharedOptPtr *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (string *)0x25b5e2);
      }
      seperator = (string *)local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_121 + 1),"=",(allocator *)seperator);
      splitHalf(in_stack_fffffffffffffe38,
                (string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),seperator,
                in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      std::__cxx11::string::~string((string *)(local_121 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_121);
      in_stack_fffffffffffffe20 = (string *)local_149;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_149 + 1)," \t",(allocator *)in_stack_fffffffffffffe20);
      trimRight(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                (string *)in_stack_fffffffffffffe00);
      std::__cxx11::string::~string((string *)(local_149 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_149);
      in_stack_fffffffffffffe18 = (string *)local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_171 + 1)," \t\n",(allocator *)in_stack_fffffffffffffe18);
      trimLeft(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (string *)in_stack_fffffffffffffe00);
      std::__cxx11::string::~string((string *)(local_171 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_171);
      local_51 = 1;
    }
    if ((local_51 & 1) == 0) break;
    std::__cxx11::string::operator+=(local_50," ");
    std::__cxx11::string::operator+=(local_50,local_80);
  }
  uVar6 = __cxa_allocate_exception(0x38);
  SyntaxError::SyntaxError
            ((SyntaxError *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (Type)((ulong)in_stack_fffffffffffffe38 >> 0x20),
             (string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  __cxa_throw(uVar6,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
}

Assistant:

void doParse() {
					 int lineNr = 0;
					 std::string sectionName;      // current section name
					 std::string sectionValue;     // current section value
					 bool inSection = false;       // true if multi line section value
					 FindType ft = OptionContext::find_name_or_prefix;
					 SharedOptPtr opt;
					 // reads the config file.
					 // A config file may only contain empty lines, single line comments or
					 // sections structured in a name = value fashion.
					 // value can span multiple lines, but parts in different lines than name
					 // must not contain a '='-Character.
					 for (std::string line; std::getline(in_, line);) {
						 ++lineNr;
						 trimLeft(line);
						 trimRight(line);

						 if (line.empty() || line.find("#") == 0) {
							 // An empty line or single line comment stops a multi line section value.
							 if (inSection) {
								 if ((opt = getOption(sectionName.c_str(), ft)).get())
									 addOptionValue(opt, sectionValue);
								 inSection = false;
							 }
							 continue;
						 }
						 std::string::size_type pos;
						 if ((pos = line.find("=")) != std::string::npos) {
							 // A new section terminates a multi line section value.
							 // First process the current section value...
							 if (inSection && (opt = getOption(sectionName.c_str(), ft)).get()) {
								 addOptionValue(opt, sectionValue);
							 }
							 // ...then save the new section's value.
							 splitHalf(line, "=", sectionName, sectionValue);
							 trimRight(sectionName);
							 trimLeft(sectionValue, " \t\n");
							 inSection = true;
						 }
						 else if (inSection) {
							 sectionValue += " ";
							 sectionValue += line;
						 }
						 else {
							 throw SyntaxError(SyntaxError::invalid_format, line);
						 }
					 }
					 if (inSection) { // file does not end with an empty line
						 if ((opt = getOption(sectionName.c_str(), ft)).get())
							 addOptionValue(opt, sectionValue);
					 }
				 }